

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O2

void __thiscall bsplib::A2A::~A2A(A2A *this)

{
  if (this->m_recv_win != (MPI_Win)&ompi_mpi_win_null) {
    MPI_Win_free(&this->m_recv_win);
  }
  MPI_Comm_free(&this->m_comm);
  this->m_comm = (MPI_Comm)&ompi_mpi_comm_null;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_ready).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::~_Vector_base
            (&(this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
            );
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_small_recv_buf).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_small_send_buf).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_recv_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_send_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  LinCost::~LinCost(&this->m_lincost);
  return;
}

Assistant:

A2A::~A2A()
{
    if ( m_recv_win != MPI_WIN_NULL )
        MPI_Win_free( &m_recv_win );

    MPI_Comm_free( &m_comm );
    m_comm = MPI_COMM_NULL;
}